

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.hpp
# Opt level: O0

Option<Kernel::TermList> __thiscall
Kernel::OnlyMemorizeNonVar<Kernel::TermList>::get
          (OnlyMemorizeNonVar<Kernel::TermList> *this,AutoDerefTermSpec *arg)

{
  bool bVar1;
  TermSpec *this_00;
  MaybeUninit<Kernel::TermList> extraout_RDX;
  TermSpec *in_RSI;
  undefined8 *in_RDI;
  Option<Kernel::TermList> OVar2;
  Option<Kernel::TermSpec> key;
  AutoDerefTermSpec *in_stack_ffffffffffffff80;
  OnlyMemorizeNonVar<Kernel::TermList> *in_stack_ffffffffffffff88;
  Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash> *this_01;
  Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash> local_30;
  
  this_01 = &local_30;
  memoKey(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  bVar1 = Lib::OptionBase<Kernel::TermSpec>::isSome((OptionBase<Kernel::TermSpec> *)this_01);
  if (bVar1) {
    this_00 = Lib::Option<Kernel::TermSpec>::operator*((Option<Kernel::TermSpec> *)0x968a82);
    Lib::Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash>::tryGet(this_01,in_RSI);
    Lib::Option<const_Kernel::TermList_&>::toOwned((Option<const_Kernel::TermList_&> *)this_00);
  }
  else {
    *in_RDI = 0;
    in_RDI[1] = 0;
    Lib::Option<Kernel::TermList>::Option((Option<Kernel::TermList> *)0x968ac2);
  }
  Lib::Option<Kernel::TermSpec>::~Option((Option<Kernel::TermSpec> *)0x968ad0);
  OVar2.super_OptionBase<Kernel::TermList>._elem._elem = extraout_RDX._elem;
  OVar2.super_OptionBase<Kernel::TermList>._0_8_ = in_RDI;
  return (Option<Kernel::TermList>)OVar2.super_OptionBase<Kernel::TermList>;
}

Assistant:

Option<Result> get(AutoDerefTermSpec const& arg)
  { 
    auto key = memoKey(arg);
    return key.isSome()
       ? _memo.tryGet(*key).toOwned()
       : Option<Result>(); 
  }